

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidgetPrivate::clipToEffectiveMask(QWidgetPrivate *this,QRegion *region)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  QRegion local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&this->field_0x8;
  lVar4 = lVar2;
  if ((this->graphicsEffect != (QGraphicsEffect *)0x0) &&
     ((*(byte *)(*(long *)(lVar2 + 0x20) + 0xc) & 1) == 0)) {
    lVar4 = *(long *)(*(long *)(lVar2 + 8) + 0x10);
  }
  do {
    if (lVar4 == 0) break;
    lVar3 = *(long *)(*(long *)(lVar4 + 8) + 0x78);
    if ((lVar3 != 0) && ((*(byte *)(lVar3 + 0x7c) & 0x80) != 0)) {
      if (lVar4 == lVar2) {
        QRegion::QRegion(&local_38,(QRegion *)(lVar3 + 0x40));
      }
      else {
        QRegion::translated((int)&local_38,(int)(QRegion *)(lVar3 + 0x40));
      }
      QRegion::operator&=(region,&local_38);
      QRegion::~QRegion(&local_38);
    }
    uVar1 = *(uint *)(*(long *)(lVar4 + 0x20) + 0xc);
    if ((uVar1 & 1) == 0) {
      lVar4 = *(long *)(*(long *)(lVar4 + 8) + 0x10);
    }
  } while ((uVar1 & 1) == 0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::clipToEffectiveMask(QRegion &region) const
{
    Q_Q(const QWidget);

    const QWidget *w = q;
    QPoint offset;

#if QT_CONFIG(graphicseffect)
    if (graphicsEffect && !w->isWindow()) {
        w = q->parentWidget();
        offset -= data.crect.topLeft();
    }
#endif // QT_CONFIG(graphicseffect)

    while (w) {
        const QWidgetPrivate *wd = w->d_func();
        if (wd->extra && wd->extra->hasMask)
            region &= (w != q) ? wd->extra->mask.translated(offset) : wd->extra->mask;
        if (w->isWindow())
            return;
        offset -= wd->data.crect.topLeft();
        w = w->parentWidget();
    }
}